

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_isorr_rr_moved.c
# Opt level: O0

void test_read_format_isorr_rr_moved(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  char *pcVar4;
  la_int64_t lVar5;
  time_t tVar6;
  long v2;
  stat_conflict *psVar7;
  int local_3c;
  longlong lStack_38;
  int i;
  int64_t offset;
  size_t size;
  void *p;
  archive *a;
  archive_entry *ae;
  char *refname;
  
  ae = (archive_entry *)anon_var_dwarf_2695a;
  extract_reference_file("test_read_format_iso_rockridge_rr_moved.iso.Z");
  p = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                   ,L'G',(uint)((archive *)p != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                      ,L'H',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                      ,L'I',0,"0",(long)iVar1,"archive_read_support_format_all(a)",(void *)0x0);
  wVar2 = archive_read_open_filename((archive_conflict *)p,(char *)ae,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                      ,L'K',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",(void *)0x0);
  for (local_3c = 0; local_3c < 0xd; local_3c = local_3c + 1) {
    iVar1 = archive_read_next_header((archive *)p,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                        ,L'P',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                        ,L'R',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)p);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                        ,L'S',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                        "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",p);
    pcVar4 = archive_entry_pathname((archive_entry *)a);
    iVar1 = strcmp(".",pcVar4);
    if (iVar1 == 0) {
      mVar3 = archive_entry_filetype((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'W',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",
                          (void *)0x0);
      lVar5 = archive_entry_size((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'X',0x800,"2048",lVar5,"archive_entry_size(ae)",(void *)0x0);
      tVar6 = archive_entry_mtime((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'Z',0x15181,"86401",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
      v2 = archive_entry_mtime_nsec((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'[',0,"0",v2,"archive_entry_mtime_nsec(ae)",(void *)0x0);
      psVar7 = archive_entry_stat((archive_entry_conflict *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L']',3,"3",psVar7->st_nlink,"archive_entry_stat(ae)->st_nlink",
                          (void *)0x0);
      lVar5 = archive_entry_uid((archive_entry *)a);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'^',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
      iVar1 = archive_read_data_block
                        ((archive *)p,(void **)&size,(size_t *)&offset,&stack0xffffffffffffffc8);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'`',1,"ARCHIVE_EOF",(long)iVar1,
                          "archive_read_data_block(a, &p, &size, &offset)",p);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                          ,L'a',(long)(int)offset,"(int)size",0,"0",(void *)0x0);
    }
    else {
      pcVar4 = archive_entry_pathname((archive_entry *)a);
      iVar1 = strcmp("dir1",pcVar4);
      if (iVar1 == 0) {
        pcVar4 = archive_entry_pathname((archive_entry *)a);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                   ,L'd',"dir1","\"dir1\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
        mVar3 = archive_entry_filetype((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                            ,L'e',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",
                            (void *)0x0);
        lVar5 = archive_entry_size((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                            ,L'f',0x800,"2048",lVar5,"archive_entry_size(ae)",(void *)0x0);
        tVar6 = archive_entry_mtime((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                            ,L'g',0x15181,"86401",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
        tVar6 = archive_entry_atime((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                            ,L'h',0x15181,"86401",tVar6,"archive_entry_atime(ae)",(void *)0x0);
        psVar7 = archive_entry_stat((archive_entry_conflict *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                            ,L'i',3,"3",psVar7->st_nlink,"archive_entry_stat(ae)->st_nlink",
                            (void *)0x0);
        lVar5 = archive_entry_uid((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                            ,L'j',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
        lVar5 = archive_entry_gid((archive_entry *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                            ,L'k',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
      }
      else {
        pcVar4 = archive_entry_pathname((archive_entry *)a);
        iVar1 = strcmp("dir1/dir2",pcVar4);
        if (iVar1 == 0) {
          pcVar4 = archive_entry_pathname((archive_entry *)a);
          assertion_equal_string
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                     ,L'p',"dir1/dir2","\"dir1/dir2\"",pcVar4,"archive_entry_pathname(ae)",
                     (void *)0x0,L'\0');
          mVar3 = archive_entry_filetype((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                              ,L'q',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",
                              (void *)0x0);
          lVar5 = archive_entry_size((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                              ,L'r',0x800,"2048",lVar5,"archive_entry_size(ae)",(void *)0x0);
          tVar6 = archive_entry_mtime((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                              ,L's',0x15181,"86401",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
          tVar6 = archive_entry_atime((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                              ,L't',0x15181,"86401",tVar6,"archive_entry_atime(ae)",(void *)0x0);
          psVar7 = archive_entry_stat((archive_entry_conflict *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                              ,L'u',3,"3",psVar7->st_nlink,"archive_entry_stat(ae)->st_nlink",
                              (void *)0x0);
          lVar5 = archive_entry_uid((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                              ,L'v',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
          lVar5 = archive_entry_gid((archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                              ,L'w',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
        }
        else {
          pcVar4 = archive_entry_pathname((archive_entry *)a);
          iVar1 = strcmp("dir1/dir2/dir3",pcVar4);
          if (iVar1 == 0) {
            pcVar4 = archive_entry_pathname((archive_entry *)a);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                       ,L'|',"dir1/dir2/dir3","\"dir1/dir2/dir3\"",pcVar4,
                       "archive_entry_pathname(ae)",(void *)0x0,L'\0');
            mVar3 = archive_entry_filetype((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                ,L'}',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",
                                (void *)0x0);
            lVar5 = archive_entry_size((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                ,L'~',0x800,"2048",lVar5,"archive_entry_size(ae)",(void *)0x0);
            tVar6 = archive_entry_mtime((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                ,L'\x7f',0x15181,"86401",tVar6,"archive_entry_mtime(ae)",(void *)0x0
                               );
            tVar6 = archive_entry_atime((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                ,L'\x80',0x15181,"86401",tVar6,"archive_entry_atime(ae)",(void *)0x0
                               );
            psVar7 = archive_entry_stat((archive_entry_conflict *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                ,L'\x81',3,"3",psVar7->st_nlink,"archive_entry_stat(ae)->st_nlink",
                                (void *)0x0);
            lVar5 = archive_entry_uid((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                ,L'\x82',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
            lVar5 = archive_entry_gid((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                ,L'\x83',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
          }
          else {
            pcVar4 = archive_entry_pathname((archive_entry *)a);
            iVar1 = strcmp("dir1/dir2/dir3/dir4",pcVar4);
            if (iVar1 == 0) {
              pcVar4 = archive_entry_pathname((archive_entry *)a);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                         ,L'\x88',"dir1/dir2/dir3/dir4","\"dir1/dir2/dir3/dir4\"",pcVar4,
                         "archive_entry_pathname(ae)",(void *)0x0,L'\0');
              mVar3 = archive_entry_filetype((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                  ,L'\x89',0x4000,"AE_IFDIR",(ulong)mVar3,
                                  "archive_entry_filetype(ae)",(void *)0x0);
              lVar5 = archive_entry_size((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                  ,L'\x8a',0x800,"2048",lVar5,"archive_entry_size(ae)",(void *)0x0);
              tVar6 = archive_entry_mtime((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                  ,L'\x8b',0x15181,"86401",tVar6,"archive_entry_mtime(ae)",
                                  (void *)0x0);
              tVar6 = archive_entry_atime((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                  ,L'\x8c',0x15181,"86401",tVar6,"archive_entry_atime(ae)",
                                  (void *)0x0);
              psVar7 = archive_entry_stat((archive_entry_conflict *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                  ,L'\x8d',3,"3",psVar7->st_nlink,"archive_entry_stat(ae)->st_nlink"
                                  ,(void *)0x0);
              lVar5 = archive_entry_uid((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                  ,L'\x8e',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
              lVar5 = archive_entry_gid((archive_entry *)a);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                  ,L'\x8f',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
            }
            else {
              pcVar4 = archive_entry_pathname((archive_entry *)a);
              iVar1 = strcmp("dir1/dir2/dir3/dir4/dir5",pcVar4);
              if (iVar1 == 0) {
                pcVar4 = archive_entry_pathname((archive_entry *)a);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                           ,L'\x94',"dir1/dir2/dir3/dir4/dir5","\"dir1/dir2/dir3/dir4/dir5\"",pcVar4
                           ,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
                mVar3 = archive_entry_filetype((archive_entry *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                    ,L'\x95',0x4000,"AE_IFDIR",(ulong)mVar3,
                                    "archive_entry_filetype(ae)",(void *)0x0);
                lVar5 = archive_entry_size((archive_entry *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                    ,L'\x96',0x800,"2048",lVar5,"archive_entry_size(ae)",(void *)0x0
                                   );
                tVar6 = archive_entry_mtime((archive_entry *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                    ,L'\x97',0x15181,"86401",tVar6,"archive_entry_mtime(ae)",
                                    (void *)0x0);
                tVar6 = archive_entry_atime((archive_entry *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                    ,L'\x98',0x15181,"86401",tVar6,"archive_entry_atime(ae)",
                                    (void *)0x0);
                psVar7 = archive_entry_stat((archive_entry_conflict *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                    ,L'\x99',3,"3",psVar7->st_nlink,
                                    "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                lVar5 = archive_entry_uid((archive_entry *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                    ,L'\x9a',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
                lVar5 = archive_entry_gid((archive_entry *)a);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                    ,L'\x9b',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
              }
              else {
                pcVar4 = archive_entry_pathname((archive_entry *)a);
                iVar1 = strcmp("dir1/dir2/dir3/dir4/dir5/dir6",pcVar4);
                if (iVar1 == 0) {
                  pcVar4 = archive_entry_pathname((archive_entry *)a);
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                             ,L'\xa0',"dir1/dir2/dir3/dir4/dir5/dir6",
                             "\"dir1/dir2/dir3/dir4/dir5/dir6\"",pcVar4,"archive_entry_pathname(ae)"
                             ,(void *)0x0,L'\0');
                  mVar3 = archive_entry_filetype((archive_entry *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                      ,L'¡',0x4000,"AE_IFDIR",(ulong)mVar3,
                                      "archive_entry_filetype(ae)",(void *)0x0);
                  lVar5 = archive_entry_size((archive_entry *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                      ,L'¢',0x800,"2048",lVar5,"archive_entry_size(ae)",(void *)0x0
                                     );
                  tVar6 = archive_entry_mtime((archive_entry *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                      ,L'£',0x15181,"86401",tVar6,"archive_entry_mtime(ae)",
                                      (void *)0x0);
                  tVar6 = archive_entry_atime((archive_entry *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                      ,L'¤',0x15181,"86401",tVar6,"archive_entry_atime(ae)",
                                      (void *)0x0);
                  psVar7 = archive_entry_stat((archive_entry_conflict *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                      ,L'¥',3,"3",psVar7->st_nlink,
                                      "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                  lVar5 = archive_entry_uid((archive_entry *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                      ,L'¦',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
                  lVar5 = archive_entry_gid((archive_entry *)a);
                  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                      ,L'§',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
                }
                else {
                  pcVar4 = archive_entry_pathname((archive_entry *)a);
                  iVar1 = strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7",pcVar4);
                  if (iVar1 == 0) {
                    pcVar4 = archive_entry_pathname((archive_entry *)a);
                    assertion_equal_string
                              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                               ,L'¬',"dir1/dir2/dir3/dir4/dir5/dir6/dir7",
                               "\"dir1/dir2/dir3/dir4/dir5/dir6/dir7\"",pcVar4,
                               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
                    mVar3 = archive_entry_filetype((archive_entry *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                        ,L'­',0x4000,"AE_IFDIR",(ulong)mVar3,
                                        "archive_entry_filetype(ae)",(void *)0x0);
                    lVar5 = archive_entry_size((archive_entry *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                        ,L'®',0x800,"2048",lVar5,"archive_entry_size(ae)",
                                        (void *)0x0);
                    tVar6 = archive_entry_mtime((archive_entry *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                        ,L'¯',0x15181,"86401",tVar6,"archive_entry_mtime(ae)",
                                        (void *)0x0);
                    tVar6 = archive_entry_atime((archive_entry *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                        ,L'°',0x15181,"86401",tVar6,"archive_entry_atime(ae)",
                                        (void *)0x0);
                    psVar7 = archive_entry_stat((archive_entry_conflict *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                        ,L'±',3,"3",psVar7->st_nlink,
                                        "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                    lVar5 = archive_entry_uid((archive_entry *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                        ,L'²',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
                    lVar5 = archive_entry_gid((archive_entry *)a);
                    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                        ,L'³',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
                  }
                  else {
                    pcVar4 = archive_entry_pathname((archive_entry *)a);
                    iVar1 = strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7/dir8",pcVar4);
                    if (iVar1 == 0) {
                      pcVar4 = archive_entry_pathname((archive_entry *)a);
                      assertion_equal_string
                                ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                 ,L'º',"dir1/dir2/dir3/dir4/dir5/dir6/dir7/dir8",
                                 "\"dir1/dir2/dir3/dir4/dir5/dir6/dir7\" \"/dir8\"",pcVar4,
                                 "archive_entry_pathname(ae)",(void *)0x0,L'\0');
                      mVar3 = archive_entry_filetype((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                          ,L'»',0x4000,"AE_IFDIR",(ulong)mVar3,
                                          "archive_entry_filetype(ae)",(void *)0x0);
                      lVar5 = archive_entry_size((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                          ,L'¼',0x800,"2048",lVar5,"archive_entry_size(ae)",
                                          (void *)0x0);
                      tVar6 = archive_entry_mtime((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                          ,L'½',0x15181,"86401",tVar6,"archive_entry_mtime(ae)",
                                          (void *)0x0);
                      tVar6 = archive_entry_atime((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                          ,L'¾',0x15181,"86401",tVar6,"archive_entry_atime(ae)",
                                          (void *)0x0);
                      psVar7 = archive_entry_stat((archive_entry_conflict *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                          ,L'¿',3,"3",psVar7->st_nlink,
                                          "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                      lVar5 = archive_entry_uid((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                          ,L'À',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
                      lVar5 = archive_entry_gid((archive_entry *)a);
                      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                          ,L'Á',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
                    }
                    else {
                      pcVar4 = archive_entry_pathname((archive_entry *)a);
                      iVar1 = strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7/dir8/dir9",pcVar4);
                      if (iVar1 == 0) {
                        pcVar4 = archive_entry_pathname((archive_entry *)a);
                        assertion_equal_string
                                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                   ,L'È',"dir1/dir2/dir3/dir4/dir5/dir6/dir7/dir8/dir9",
                                   "\"dir1/dir2/dir3/dir4/dir5/dir6/dir7\" \"/dir8/dir9\"",pcVar4,
                                   "archive_entry_pathname(ae)",(void *)0x0,L'\0');
                        mVar3 = archive_entry_filetype((archive_entry *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'É',0x4000,"AE_IFDIR",(ulong)mVar3,
                                            "archive_entry_filetype(ae)",(void *)0x0);
                        lVar5 = archive_entry_size((archive_entry *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'Ê',0x800,"2048",lVar5,"archive_entry_size(ae)",
                                            (void *)0x0);
                        tVar6 = archive_entry_mtime((archive_entry *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'Ë',0x15181,"86401",tVar6,"archive_entry_mtime(ae)",
                                            (void *)0x0);
                        tVar6 = archive_entry_atime((archive_entry *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'Ì',0x15181,"86401",tVar6,"archive_entry_atime(ae)",
                                            (void *)0x0);
                        psVar7 = archive_entry_stat((archive_entry_conflict *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'Í',3,"3",psVar7->st_nlink,
                                            "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                        lVar5 = archive_entry_uid((archive_entry *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'Î',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0);
                        lVar5 = archive_entry_gid((archive_entry *)a);
                        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                            ,L'Ï',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0);
                      }
                      else {
                        pcVar4 = archive_entry_pathname((archive_entry *)a);
                        iVar1 = strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7/dir8/dir9/dir10",pcVar4);
                        if (iVar1 == 0) {
                          pcVar4 = archive_entry_pathname((archive_entry *)a);
                          assertion_equal_string
                                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                     ,L'Ö',"dir1/dir2/dir3/dir4/dir5/dir6/dir7/dir8/dir9/dir10",
                                     "\"dir1/dir2/dir3/dir4/dir5/dir6/dir7\" \"/dir8/dir9/dir10\"",
                                     pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
                          mVar3 = archive_entry_filetype((archive_entry *)a);
                          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                              ,L'×',0x4000,"AE_IFDIR",(ulong)mVar3,
                                              "archive_entry_filetype(ae)",(void *)0x0);
                          lVar5 = archive_entry_size((archive_entry *)a);
                          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                              ,L'Ø',0x800,"2048",lVar5,"archive_entry_size(ae)",
                                              (void *)0x0);
                          tVar6 = archive_entry_mtime((archive_entry *)a);
                          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                              ,L'Ù',0x15181,"86401",tVar6,"archive_entry_mtime(ae)"
                                              ,(void *)0x0);
                          tVar6 = archive_entry_atime((archive_entry *)a);
                          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                              ,L'Ú',0x15181,"86401",tVar6,"archive_entry_atime(ae)"
                                              ,(void *)0x0);
                          psVar7 = archive_entry_stat((archive_entry_conflict *)a);
                          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                              ,L'Û',2,"2",psVar7->st_nlink,
                                              "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                          lVar5 = archive_entry_uid((archive_entry *)a);
                          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                              ,L'Ü',1,"1",lVar5,"archive_entry_uid(ae)",(void *)0x0
                                             );
                          lVar5 = archive_entry_gid((archive_entry *)a);
                          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                              ,L'Ý',2,"2",lVar5,"archive_entry_gid(ae)",(void *)0x0
                                             );
                        }
                        else {
                          pcVar4 = archive_entry_pathname((archive_entry *)a);
                          iVar1 = strcmp("file",pcVar4);
                          if (iVar1 == 0) {
                            pcVar4 = archive_entry_pathname((archive_entry *)a);
                            assertion_equal_string
                                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                       ,L'à',"file","\"file\"",pcVar4,"archive_entry_pathname(ae)",
                                       (void *)0x0,L'\0');
                            mVar3 = archive_entry_filetype((archive_entry *)a);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'á',0x8000,"AE_IFREG",(ulong)mVar3,
                                                "archive_entry_filetype(ae)",(void *)0x0);
                            lVar5 = archive_entry_size((archive_entry *)a);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'â',0xbc6154,"12345684",lVar5,
                                                "archive_entry_size(ae)",(void *)0x0);
                            iVar1 = archive_read_data_block
                                              ((archive *)p,(void **)&size,(size_t *)&offset,
                                               &stack0xffffffffffffffc8);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'ä',0,"0",(long)iVar1,
                                                "archive_read_data_block(a, &p, &size, &offset)",
                                                (void *)0x0);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'å',0,"0",lStack_38,"offset",(void *)0x0);
                            assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'æ',(void *)size,"p","hello\n","\"hello\\n\"",6,
                                                "6",(void *)0x0);
                            tVar6 = archive_entry_mtime((archive_entry *)a);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'ç',0x15181,"86401",tVar6,
                                                "archive_entry_mtime(ae)",(void *)0x0);
                            tVar6 = archive_entry_atime((archive_entry *)a);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'è',0x15181,"86401",tVar6,
                                                "archive_entry_atime(ae)",(void *)0x0);
                            psVar7 = archive_entry_stat((archive_entry_conflict *)a);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'é',1,"1",psVar7->st_nlink,
                                                "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                            lVar5 = archive_entry_uid((archive_entry *)a);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'ê',1,"1",lVar5,"archive_entry_uid(ae)",
                                                (void *)0x0);
                            lVar5 = archive_entry_gid((archive_entry *)a);
                            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                ,L'ë',2,"2",lVar5,"archive_entry_gid(ae)",
                                                (void *)0x0);
                          }
                          else {
                            pcVar4 = archive_entry_pathname((archive_entry *)a);
                            iVar1 = strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7/dir8/dir9/dir10/deep"
                                           ,pcVar4);
                            if (iVar1 == 0) {
                              pcVar4 = archive_entry_pathname((archive_entry *)a);
                              assertion_equal_string
                                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                         ,L'ò',
                                         "dir1/dir2/dir3/dir4/dir5/dir6/dir7/dir8/dir9/dir10/deep",
                                         "\"dir1/dir2/dir3/dir4/dir5/dir6/dir7\" \"/dir8/dir9/dir10/deep\""
                                         ,pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
                              mVar3 = archive_entry_filetype((archive_entry *)a);
                              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                  ,L'ó',0x8000,"AE_IFREG",(ulong)mVar3,
                                                  "archive_entry_filetype(ae)",(void *)0x0);
                              lVar5 = archive_entry_size((archive_entry *)a);
                              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                  ,L'ô',0xbc6154,"12345684",lVar5,
                                                  "archive_entry_size(ae)",(void *)0x0);
                              iVar1 = archive_read_data_block
                                                ((archive *)p,(void **)&size,(size_t *)&offset,
                                                 &stack0xffffffffffffffc8);
                              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                  ,L'ö',0,"0",(long)iVar1,
                                                  "archive_read_data_block(a, &p, &size, &offset)",
                                                  (void *)0x0);
                              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                  ,L'÷',0,"0",lStack_38,"offset",(void *)0x0);
                              assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                  ,L'ø',(void *)size,"p","hello\n","\"hello\\n\"",6
                                                  ,"6",(void *)0x0);
                              tVar6 = archive_entry_mtime((archive_entry *)a);
                              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                  ,L'ù',0x15181,"86401",tVar6,
                                                  "archive_entry_mtime(ae)",(void *)0x0);
                              tVar6 = archive_entry_atime((archive_entry *)a);
                              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                  ,L'ú',0x15181,"86401",tVar6,
                                                  "archive_entry_atime(ae)",(void *)0x0);
                              psVar7 = archive_entry_stat((archive_entry_conflict *)a);
                              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                  ,L'û',1,"1",psVar7->st_nlink,
                                                  "archive_entry_stat(ae)->st_nlink",(void *)0x0);
                              lVar5 = archive_entry_uid((archive_entry *)a);
                              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                  ,L'ü',1,"1",lVar5,"archive_entry_uid(ae)",
                                                  (void *)0x0);
                              lVar5 = archive_entry_gid((archive_entry *)a);
                              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                                  ,L'ý',2,"2",lVar5,"archive_entry_gid(ae)",
                                                  (void *)0x0);
                            }
                            else {
                              failure("Saw a file that shouldn\'t have been there");
                              pcVar4 = archive_entry_pathname((archive_entry *)a);
                              assertion_equal_string
                                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                                         ,L'Ā',pcVar4,"archive_entry_pathname(ae)","","\"\"",
                                         (void *)0x0,L'\0');
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  iVar1 = archive_read_next_header((archive *)p,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                      ,L'ą',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                      (void *)0x0);
  iVar1 = archive_filter_code((archive *)p,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                      ,L'Ĉ',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                      (void *)0x0);
  iVar1 = archive_format((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                      ,L'ĉ',(long)iVar1,"archive_format(a)",0x40001,
                      "ARCHIVE_FORMAT_ISO9660_ROCKRIDGE",(void *)0x0);
  iVar1 = archive_read_close((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                      ,L'Č',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",p);
  iVar1 = archive_read_free((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_isorr_rr_moved.c"
                      ,L'č',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_isorr_rr_moved)
{
	const char *refname = "test_read_format_iso_rockridge_rr_moved.iso.Z";
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;
	int i;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Retrieve each of the 8 files on the ISO image and
	 * verify that each one is what we expect. */
	for (i = 0; i < 13; ++i) {
		assertEqualInt(0, archive_read_next_header(a, &ae));

		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

		if (strcmp(".", archive_entry_pathname(ae)) == 0) {
			/* '.' root directory. */
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			/* Now, we read timestamp recorded by RRIP "TF". */
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(0, archive_entry_mtime_nsec(ae));
			/* Now, we read links recorded by RRIP "PX". */
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
		} else if (strcmp("dir1", archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1", archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2/dir3",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3/dir4",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2/dir3/dir4",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3/dir4/dir5",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2/dir3/dir4/dir5",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3/dir4/dir5/dir6",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2/dir3/dir4/dir5/dir6",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2/dir3/dir4/dir5/dir6/dir7",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7"
		   "/dir8",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2/dir3/dir4/dir5/dir6/dir7"
			    "/dir8",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7"
		   "/dir8/dir9",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2/dir3/dir4/dir5/dir6/dir7"
			    "/dir8/dir9",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7"
		   "/dir8/dir9/dir10",
		    archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir1/dir2/dir3/dir4/dir5/dir6/dir7"
			    "/dir8/dir9/dir10",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("file", archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualString("file", archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(12345684, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello\n", 6);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("dir1/dir2/dir3/dir4/dir5/dir6/dir7"
		    "/dir8/dir9/dir10/deep",
		    archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualString("dir1/dir2/dir3/dir4/dir5/dir6/dir7"
			    "/dir8/dir9/dir10/deep",
			    archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(12345684, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello\n", 6);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else {
			failure("Saw a file that shouldn't have been there");
			assertEqualString(archive_entry_pathname(ae), "");
		}
	}

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660_ROCKRIDGE);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}